

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

int32_t duckdb::TimeBucket::EpochMonths<duckdb::date_t>(date_t ts)

{
  date_t date;
  int32_t iVar1;
  int32_t iVar2;
  undefined8 in_RAX;
  
  date = Cast::Operation<duckdb::date_t,duckdb::date_t>(ts);
  iVar1 = Date::ExtractYear((date_t)(int32_t)((ulong)in_RAX >> 0x20));
  iVar2 = Date::ExtractMonth(date);
  return iVar2 + iVar1 * 0xc + -0x5c59;
}

Assistant:

static inline int32_t EpochMonths(T ts) {
		date_t ts_date = Cast::template Operation<T, date_t>(ts);
		return (Date::ExtractYear(ts_date) - 1970) * 12 + Date::ExtractMonth(ts_date) - 1;
	}